

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertions.h
# Opt level: O1

void cgreen::assert_that_<bool>
               (char *file,int line,char *actual_string,bool actual,Constraint *constraint)

{
  char *__s1;
  int iVar1;
  string local_31;
  
  __s1 = _xmlNodeGetContent;
  if (_xmlNodeGetContent != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
    if (*_xmlNodeGetContent == '*') {
      if (_xmlNodeGetContent == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE")
      goto LAB_0010eb9b;
    }
    else {
      iVar1 = strcmp(_xmlNodeGetContent,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
      if ((__s1 == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") || (iVar1 == 0))
      goto LAB_0010eb9b;
    }
    if (*__s1 == '*') {
      if (__s1 == "PKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") goto LAB_0010eb9b;
    }
    else {
      iVar1 = strcmp(__s1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
      if ((__s1 == "PKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") || (iVar1 == 0))
      goto LAB_0010eb9b;
    }
    if (*__s1 == '*') {
      if (__s1 == "PNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") goto LAB_0010eb9b;
    }
    else {
      iVar1 = strcmp(__s1,"PKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
      if ((__s1 == "PNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") || (iVar1 == 0))
      goto LAB_0010eb9b;
    }
    if ((*__s1 == '*') ||
       (iVar1 = strcmp(__s1,"PNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"), iVar1 != 0)) {
      if ((__s1 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") &&
         ((*__s1 == '*' ||
          (iVar1 = strcmp(__s1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"), iVar1 != 0))
         )) {
        cgreen::assert_that_(file,line,actual_string,(ulong)actual,constraint);
        return;
      }
      cgreen::assert_that_(file,line,actual_string,&local_31,constraint);
      return;
    }
  }
LAB_0010eb9b:
  cgreen::assert_that_(file,line,actual_string,(string *)(ulong)actual,constraint);
  return;
}

Assistant:

void assert_that_(const char *file, int line, const char *actual_string, T actual, Constraint *constraint) {

        if (typeid(actual) == typeid(std::string&) ||
            typeid(actual) == typeid(const std::string&) ||
            typeid(actual) == typeid(const std::string*) ||
            typeid(actual) == typeid(std::string*)) {

            assert_that_(file, line, actual_string, reinterpret_cast<const std::string *>(actual), constraint);

        } else if (typeid(actual) == typeid(std::string)) {

            assert_that_(file, line, actual_string, (const std::string *)&actual, constraint);

        } else {
            // TODO: update actual_string with output from operator<< of (T)actual
            assert_that_(file, line, actual_string, (intptr_t)actual, constraint);
        }
    }